

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Prepare
          (ParameterSetupErrorsTest *this)

{
  GLenum *pGVar1;
  code *pcVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  uint uVar10;
  long lVar9;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar9 + 0x400))(0xde1,1,&this->m_to_2D);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c59);
  (**(code **)(lVar9 + 0x400))(0x9100,1,&this->m_to_2D_ms);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c5d);
  (**(code **)(lVar9 + 0x400))(0x84f5,1,&this->m_to_rectangle);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c61);
  do {
    pcVar2 = *(code **)(lVar9 + 0xcc8);
    this->m_to_invalid = this->m_to_invalid + 1;
    cVar3 = (*pcVar2)();
  } while (cVar3 != '\0');
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"glIsTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c66);
  GVar6 = this->m_pname_invalid;
  do {
    GVar6 = GVar6 + 1;
    lVar9 = 0;
    do {
      if (lVar9 == 0x4c) {
        this->m_pname_invalid = GVar6;
        uVar7 = this->m_depth_stencil_mode_invalid;
        do {
          uVar8 = uVar7 + 1;
          uVar10 = uVar7 & 0xfffffffe;
          uVar7 = uVar8;
        } while (uVar10 == 0x1900);
        this->m_depth_stencil_mode_invalid = uVar8;
        return;
      }
      pGVar1 = (GLenum *)((long)&DAT_0171acb0 + lVar9);
      lVar9 = lVar9 + 4;
    } while (*pGVar1 != GVar6);
  } while( true );
}

Assistant:

void ParameterSetupErrorsTest::Prepare()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Auxiliary objects setup. */

	/* 2D */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* 3D */
	gl.createTextures(GL_TEXTURE_2D_MULTISAMPLE, 1, &m_to_2D_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* RECTANGLE */
	gl.createTextures(GL_TEXTURE_RECTANGLE, 1, &m_to_rectangle);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* Invalid texture object. */
	while (gl.isTexture(++m_to_invalid))
		;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

	/* Invalid parameter name. */
	glw::GLenum all_pnames[] = { GL_DEPTH_STENCIL_TEXTURE_MODE,
								 GL_TEXTURE_BASE_LEVEL,
								 GL_TEXTURE_COMPARE_FUNC,
								 GL_TEXTURE_COMPARE_MODE,
								 GL_TEXTURE_LOD_BIAS,
								 GL_TEXTURE_MIN_FILTER,
								 GL_TEXTURE_MAG_FILTER,
								 GL_TEXTURE_MIN_LOD,
								 GL_TEXTURE_MAX_LOD,
								 GL_TEXTURE_MAX_LEVEL,
								 GL_TEXTURE_SWIZZLE_R,
								 GL_TEXTURE_SWIZZLE_G,
								 GL_TEXTURE_SWIZZLE_B,
								 GL_TEXTURE_SWIZZLE_A,
								 GL_TEXTURE_WRAP_S,
								 GL_TEXTURE_WRAP_T,
								 GL_TEXTURE_WRAP_R,
								 GL_TEXTURE_BORDER_COLOR,
								 GL_TEXTURE_SWIZZLE_RGBA };
	glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

	bool is_valid = true;

	while (is_valid)
	{
		is_valid = false;
		++m_pname_invalid;

		for (glw::GLuint i = 0; i < all_pnames_count; ++i)
		{
			if (all_pnames[i] == m_pname_invalid)
			{
				is_valid = true;

				break;
			}
		}
	}

	/* Invalid depth stencil mode name. */
	glw::GLenum all_depth_stencil_modes[]	 = { GL_DEPTH_COMPONENT, GL_STENCIL_INDEX };
	glw::GLuint all_depth_stencil_modes_count = sizeof(all_depth_stencil_modes) / sizeof(all_depth_stencil_modes[0]);

	is_valid = true;

	while (is_valid)
	{
		is_valid = false;
		++m_depth_stencil_mode_invalid;

		for (glw::GLuint i = 0; i < all_depth_stencil_modes_count; ++i)
		{
			if (all_depth_stencil_modes[i] == m_depth_stencil_mode_invalid)
			{
				is_valid = true;

				break;
			}
		}
	}
}